

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSort.c
# Opt level: O2

void Msat_SolverSortSelection(Msat_Clause_t **array,int size)

{
  Msat_Clause_t *pMVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  iVar2 = 1;
  if (1 < size) {
    iVar2 = size;
  }
  uVar5 = 1;
  for (uVar6 = 0; uVar6 != iVar2 - 1; uVar6 = uVar6 + 1) {
    uVar8 = uVar6 & 0xffffffff;
    uVar4 = uVar5;
    while( true ) {
      uVar7 = (uint)uVar8;
      if ((uint)size == uVar4) break;
      fVar9 = Msat_ClauseReadActivity(array[uVar4]);
      fVar10 = Msat_ClauseReadActivity(array[(int)uVar7]);
      uVar3 = (uint)uVar4;
      if (fVar10 <= fVar9) {
        uVar3 = uVar7;
      }
      uVar4 = uVar4 + 1;
      uVar8 = (ulong)uVar3;
    }
    pMVar1 = array[uVar6];
    array[uVar6] = array[(int)uVar7];
    array[(int)uVar7] = pMVar1;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void Msat_SolverSortSelection( Msat_Clause_t ** array, int size )
{
    Msat_Clause_t * tmp;
    int i, j, best_i;
    for ( i = 0; i < size-1; i++ )
    {
        best_i = i;
        for (j = i+1; j < size; j++)
        {
            if ( Msat_ClauseReadActivity(array[j]) < Msat_ClauseReadActivity(array[best_i]) )
                best_i = j;
        }
        tmp = array[i]; array[i] = array[best_i]; array[best_i] = tmp;
    }
}